

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::tree_clusterizer
          (tree_clusterizer<crnlib::vec<2U,_float>_> *this)

{
  tree_clusterizer<crnlib::vec<2U,_float>_> *this_local;
  
  vector<crnlib::vec<2U,_float>_>::vector(&this->m_weightedVectors);
  vector<double>::vector(&this->m_weightedDotProducts);
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::VectorInfo>::vector
            (&this->m_vectorsInfo);
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::VectorInfo>::vector
            (&this->m_vectorsInfoLeft);
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::VectorInfo>::vector
            (&this->m_vectorsInfoRight);
  vector<bool>::vector(&this->m_vectorComparison);
  hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
  ::hash_map(&this->m_node_index_map);
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::vq_node>::vector(&this->m_nodes);
  vector<crnlib::vec<2U,_float>_>::vector(&this->m_codebook);
  return;
}

Assistant:

tree_clusterizer()
        {
        }